

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_flush_jmp_cache_x86_64(CPUState *cpu,target_ulong addr)

{
  uint uVar1;
  
  uVar1 = (uint)addr - 0x1000;
  memset((void *)((long)cpu->tb_jmp_cache + (ulong)(((uVar1 >> 0xc ^ uVar1 >> 0x12) & 0x3f) << 9)),0
         ,0x200);
  memset((void *)((long)cpu->tb_jmp_cache +
                 (ulong)((((uint)addr >> 0xc ^ (uint)(addr >> 0x12) & 0x3fff) & 0x3f) << 9)),0,0x200
        );
  return;
}

Assistant:

void tb_flush_jmp_cache(CPUState *cpu, target_ulong addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif

    /* Discard jump cache entries for any tb which might potentially
       overlap the flushed page.  */
    tb_jmp_cache_clear_page(cpu, addr - TARGET_PAGE_SIZE);
    tb_jmp_cache_clear_page(cpu, addr);
}